

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O0

void __thiscall
SMBusSignalState::AddMarkers
          (SMBusSignalState *this,AnalyzerResults *pResults,Channel *chnlSMBCLK,Channel *chnlSMBDAT)

{
  Channel *pCVar1;
  Channel *chnlSMBDAT_local;
  Channel *chnlSMBCLK_local;
  AnalyzerResults *pResults_local;
  SMBusSignalState *this_local;
  
  if ((((this->bus_signal == SMB_Zero) || (this->bus_signal == SMB_One)) ||
      (this->bus_signal == SMB_ACK)) || (this->bus_signal == SMB_NACK)) {
    AnalyzerResults::AddMarker
              ((ulonglong)pResults,(MarkerType)this->sample_rising_clk,(Channel *)0x4);
    if (this->bus_signal == SMB_Zero) {
      AnalyzerResults::AddMarker((ulonglong)pResults,(MarkerType)this->sample_marker,(Channel *)0xb)
      ;
    }
    else if (this->bus_signal == SMB_One) {
      AnalyzerResults::AddMarker((ulonglong)pResults,(MarkerType)this->sample_marker,(Channel *)0xa)
      ;
    }
    else if (this->bus_signal == SMB_ACK) {
      AnalyzerResults::AddMarker((ulonglong)pResults,(MarkerType)this->sample_marker,(Channel *)0x0)
      ;
    }
    else if (this->bus_signal == SMB_NACK) {
      AnalyzerResults::AddMarker((ulonglong)pResults,(MarkerType)this->sample_marker,(Channel *)0x1)
      ;
    }
  }
  else if ((this->bus_signal == SMB_Start) || (this->bus_signal == SMB_Stop)) {
    pCVar1 = (Channel *)0x8;
    if (this->bus_signal == SMB_Stop) {
      pCVar1 = (Channel *)0x9;
    }
    AnalyzerResults::AddMarker((ulonglong)pResults,(MarkerType)this->sample_marker,pCVar1);
  }
  return;
}

Assistant:

void SMBusSignalState::AddMarkers( AnalyzerResults* pResults, Channel& chnlSMBCLK, Channel& chnlSMBDAT )
{
    if( bus_signal == SMB_Zero || bus_signal == SMB_One || bus_signal == SMB_ACK || bus_signal == SMB_NACK )
    {
        pResults->AddMarker( sample_rising_clk, AnalyzerResults::UpArrow, chnlSMBCLK );

        if( bus_signal == SMB_Zero )
            pResults->AddMarker( sample_marker, AnalyzerResults::Zero, chnlSMBDAT );
        else if( bus_signal == SMB_One )
            pResults->AddMarker( sample_marker, AnalyzerResults::One, chnlSMBDAT );
        else if( bus_signal == SMB_ACK )
            pResults->AddMarker( sample_marker, AnalyzerResults::Dot, chnlSMBDAT );
        else if( bus_signal == SMB_NACK )
            pResults->AddMarker( sample_marker, AnalyzerResults::ErrorDot, chnlSMBDAT );
    }
    else if( bus_signal == SMB_Start || bus_signal == SMB_Stop )
    {
        pResults->AddMarker( sample_marker, bus_signal == SMB_Stop ? AnalyzerResults::Stop : AnalyzerResults::Start, chnlSMBDAT );
    }
}